

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::GetCV(ON_NurbsSurface *this,int i,int j,ON_4dPoint *point)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  
  if (-1 < (j | i)) {
    uVar2 = this->m_dim;
    if (((0 < (int)uVar2) && (i < this->m_cv_count[0])) && (j < this->m_cv_count[1])) {
      uVar3 = j * this->m_cv_stride[1] + i * this->m_cv_stride[0];
      if (-1 < (int)uVar3 && this->m_cv != (double *)0x0) {
        pdVar1 = this->m_cv + uVar3;
        point->x = *pdVar1;
        if (uVar2 < 2) {
          point->y = 0.0;
          dVar4 = 0.0;
        }
        else {
          point->y = pdVar1[1];
          dVar4 = 0.0;
          if (uVar2 != 2) {
            dVar4 = pdVar1[2];
          }
        }
        point->z = dVar4;
        if (this->m_is_rat == 0) {
          dVar4 = 1.0;
        }
        else {
          dVar4 = pdVar1[uVar2];
        }
        point->w = dVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool 
ON_NurbsSurface::GetCV( int i, int j, ON_4dPoint& point ) const
{
  bool rc = false;
  if (m_dim > 0 && i >= 0 && j >= 0 && i < m_cv_count[0] && j < m_cv_count[1])
  {
    const double* cv = CV(i, j);
    if (cv) {
      point.x = cv[0];
      point.y = (m_dim > 1) ? cv[1] : 0.0;
      point.z = (m_dim > 2) ? cv[2] : 0.0;
      point.w = (m_is_rat) ? cv[m_dim] : 1.0;
      rc = true;
    }
  }
  return rc;
}